

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O2

void __thiscall
duckdb::BinaryAggregateHeap<float,_int,_duckdb::LessThan>::Insert
          (BinaryAggregateHeap<float,_int,_duckdb::LessThan> *this,ArenaAllocator *allocator,
          float *key,int *value)

{
  STORAGE_TYPE *pSVar1;
  ulong uVar2;
  bool bVar3;
  pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<int>_> *__last;
  STORAGE_TYPE *__first;
  
  __first = this->heap;
  uVar2 = this->size;
  if (uVar2 < this->capacity) {
    pSVar1 = __first + uVar2;
    __last = pSVar1 + 1;
    (pSVar1->first).value = *key;
    (pSVar1->second).value = *value;
    this->size = uVar2 + 1;
  }
  else {
    bVar3 = GreaterThan::Operation<float>((float *)__first,key);
    if (!bVar3) {
      return;
    }
    ::std::
    pop_heap<std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<int>>*,bool(*)(std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<int>>const&,std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<int>>const&)>
              (this->heap,this->heap + this->size,Compare);
    __first = this->heap;
    __last = __first + this->size;
    __last[-1].first.value = *key;
    __last[-1].second.value = *value;
  }
  ::std::
  push_heap<std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<int>>*,bool(*)(std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<int>>const&,std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<int>>const&)>
            (__first,__last,Compare);
  return;
}

Assistant:

void Insert(ArenaAllocator &allocator, const K &key, const V &value) {
		D_ASSERT(capacity != 0); // must be initialized

		// If the heap is not full, insert the value into a new slot
		if (size < capacity) {
			heap[size].first.Assign(allocator, key);
			heap[size].second.Assign(allocator, value);
			size++;
			std::push_heap(heap, heap + size, Compare);
		}
		// If the heap is full, check if the value is greater than the smallest value in the heap
		// If it is, assign the new value to the slot and re-heapify
		else if (K_COMPARATOR::Operation(key, heap[0].first.value)) {
			std::pop_heap(heap, heap + size, Compare);
			heap[size - 1].first.Assign(allocator, key);
			heap[size - 1].second.Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		D_ASSERT(std::is_heap(heap, heap + size, Compare));
	}